

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O1

Matrix33d * gmath::createR(Matrix33d *__return_storage_ptr__,double ax,double ay,double az)

{
  undefined1 auVar1 [16];
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double local_98;
  double local_88;
  double local_78;
  double local_48;
  long lVar13;
  
  __return_storage_ptr__->v[2][0] = 0.0;
  __return_storage_ptr__->v[2][1] = 0.0;
  __return_storage_ptr__->v[1][1] = 0.0;
  __return_storage_ptr__->v[1][2] = 0.0;
  __return_storage_ptr__->v[0][2] = 0.0;
  __return_storage_ptr__->v[1][0] = 0.0;
  __return_storage_ptr__->v[0][0] = 0.0;
  __return_storage_ptr__->v[0][1] = 0.0;
  __return_storage_ptr__->v[2][2] = 0.0;
  auVar1 = _DAT_00163c20;
  lVar2 = 0;
  auVar12 = _DAT_00163c10;
  do {
    if (SUB164(auVar12 ^ auVar1,4) == -0x80000000 && SUB164(auVar12 ^ auVar1,0) < -0x7ffffffd) {
      *(undefined8 *)((long)__return_storage_ptr__->v[0] + lVar2) = 0x3ff0000000000000;
      *(undefined8 *)((long)__return_storage_ptr__->v[1] + lVar2 + 8) = 0x3ff0000000000000;
    }
    lVar13 = auVar12._8_8_;
    auVar12._0_8_ = auVar12._0_8_ + 2;
    auVar12._8_8_ = lVar13 + 2;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0x80);
  dVar3 = cos(ay);
  dVar4 = cos(az);
  local_88 = cos(ay);
  local_88 = -local_88;
  dVar5 = sin(az);
  __return_storage_ptr__->v[0][0] = dVar4 * dVar3;
  __return_storage_ptr__->v[0][1] = local_88 * dVar5;
  dVar3 = sin(ay);
  __return_storage_ptr__->v[0][2] = -dVar3;
  local_78 = sin(ax);
  local_78 = -local_78;
  dVar3 = sin(ay);
  dVar4 = cos(az);
  dVar5 = cos(ax);
  dVar6 = sin(az);
  dVar7 = sin(ax);
  dVar8 = sin(ay);
  dVar9 = sin(az);
  dVar10 = cos(ax);
  dVar11 = cos(az);
  __return_storage_ptr__->v[1][0] = dVar4 * local_78 * dVar3 + dVar6 * dVar5;
  __return_storage_ptr__->v[1][1] = dVar9 * dVar8 * dVar7 + dVar11 * dVar10;
  local_98 = sin(ax);
  local_98 = -local_98;
  dVar3 = cos(ay);
  __return_storage_ptr__->v[1][2] = dVar3 * local_98;
  dVar3 = cos(ax);
  dVar4 = sin(ay);
  dVar5 = cos(az);
  dVar6 = sin(ax);
  dVar7 = sin(az);
  local_48 = cos(ax);
  local_48 = -local_48;
  dVar8 = sin(ay);
  dVar9 = sin(az);
  dVar10 = sin(ax);
  dVar11 = cos(az);
  __return_storage_ptr__->v[2][0] = dVar5 * dVar4 * dVar3 + dVar7 * dVar6;
  __return_storage_ptr__->v[2][1] = dVar9 * local_48 * dVar8 + dVar11 * dVar10;
  dVar3 = cos(ax);
  dVar4 = cos(ay);
  __return_storage_ptr__->v[2][2] = dVar4 * dVar3;
  return __return_storage_ptr__;
}

Assistant:

Matrix33d createR(double ax, double ay, double az)
{
  Matrix33d ret;

  ret(0, 0)=cos(ay)*cos(az);
  ret(0, 1)=-cos(ay)*sin(az);
  ret(0, 2)=-sin(ay);

  ret(1, 0)=-sin(ax)*sin(ay)*cos(az)+cos(ax)*sin(az);
  ret(1, 1)=sin(ax)*sin(ay)*sin(az)+cos(ax)*cos(az);
  ret(1, 2)=-sin(ax)*cos(ay);

  ret(2, 0)=cos(ax)*sin(ay)*cos(az)+sin(ax)*sin(az);
  ret(2, 1)=-cos(ax)*sin(ay)*sin(az)+sin(ax)*cos(az);
  ret(2, 2)=cos(ax)*cos(ay);

  return ret;
}